

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O2

idx_t duckdb::ValidityAppend
                (CompressionAppendState *append_state,ColumnSegment *segment,
                SegmentStatistics *stats,UnifiedVectorFormat *data,idx_t offset,idx_t vcount)

{
  atomic<unsigned_long> *paVar1;
  sel_t *psVar2;
  byte bVar3;
  idx_t iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ValidityMask mask;
  
  iVar4 = ColumnSegment::SegmentSize(segment);
  mask.super_TemplatedValidityMask<unsigned_long>.capacity = (iVar4 & 0x1fffffffffffff00) * 8;
  uVar8 = mask.super_TemplatedValidityMask<unsigned_long>.capacity -
          (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  if (vcount < uVar8) {
    uVar8 = vcount;
  }
  if ((data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    LOCK();
    paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + uVar8;
    UNLOCK();
    (stats->statistics).has_no_null = true;
  }
  else {
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)BufferHandle::Ptr(&append_state->handle);
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar7 = 0;
    for (lVar5 = -uVar8; lVar5 != 0; lVar5 = lVar5 + 1) {
      psVar2 = data->sel->sel_vector;
      uVar6 = offset;
      if (psVar2 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar2[offset];
      }
      if (((data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6] >>
           (uVar6 & 0x3f) & 1) == 0) {
        uVar6 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
                super___atomic_base<unsigned_long>._M_i + lVar7;
        bVar3 = (byte)uVar6 & 0x3f;
        mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6] =
             mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6] &
             (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        (stats->statistics).has_null = true;
      }
      else {
        (stats->statistics).has_no_null = true;
      }
      lVar7 = lVar7 + 1;
      offset = offset + 1;
    }
    LOCK();
    paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + uVar8;
    UNLOCK();
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return uVar8;
}

Assistant:

idx_t ValidityAppend(CompressionAppendState &append_state, ColumnSegment &segment, SegmentStatistics &stats,
                     UnifiedVectorFormat &data, idx_t offset, idx_t vcount) {
	D_ASSERT(segment.GetBlockOffset() == 0);
	auto &validity_stats = stats.statistics;

	auto max_tuples = segment.SegmentSize() / ValidityMask::STANDARD_MASK_SIZE * STANDARD_VECTOR_SIZE;
	idx_t append_count = MinValue<idx_t>(vcount, max_tuples - segment.count);
	if (data.validity.AllValid()) {
		// no null values: skip append
		segment.count += append_count;
		validity_stats.SetHasNoNullFast();
		return append_count;
	}

	ValidityMask mask(reinterpret_cast<validity_t *>(append_state.handle.Ptr()), max_tuples);
	for (idx_t i = 0; i < append_count; i++) {
		auto idx = data.sel->get_index(offset + i);
		if (!data.validity.RowIsValidUnsafe(idx)) {
			mask.SetInvalidUnsafe(segment.count + i);
			validity_stats.SetHasNullFast();
		} else {
			validity_stats.SetHasNoNullFast();
		}
	}
	segment.count += append_count;
	return append_count;
}